

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_test.cxx
# Opt level: O2

void __thiscall uint32_array_digest_test::test_method(uint32_array_digest_test *this)

{
  string str;
  type array;
  char *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  digest_type hash;
  undefined **local_30;
  undefined1 local_28;
  undefined8 *local_20;
  char *local_18;
  
  array._M_elems[0] = 0;
  array._M_elems[1] = 0x11111111;
  array._M_elems[2] = 0x22222222;
  array._M_elems[3] = 0x33333333;
  hash._M_elems =
       (_Type)cryptox::
              digest<cryptox::message_digest_algorithm<&EVP_md5,128ul>,std::array<unsigned_int,4ul>>
                        (&array);
  cryptox::to_hex<std::array<unsigned_char,16ul>>(&str,(cryptox *)&hash,hash._M_elems._8_8_);
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/digest_test.cxx"
  ;
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_50,0x3d);
  local_28 = 0;
  local_30 = &PTR__lazy_ostream_002b7238;
  local_20 = &boost::unit_test::lazy_ostream::inst;
  local_18 = "";
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/digest_test.cxx"
  ;
  local_68 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[33]>
            (&local_30,&local_70,0x3d,1,2,&str,"str","89dfed81253840a81164dee0ed6be878",
             "\"89dfed81253840a81164dee0ed6be878\"");
  std::__cxx11::string::~string((string *)&str);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(uint32_array_digest_test) {
	const cryptox::array<std::uint32_t, 4>::type array = {
		0x00000000, 0x11111111,
		0x22222222, 0x33333333
	};

	const md5::digest_type hash = digest<md5>(array);
	const std::string str = to_hex(hash);
	BOOST_CHECK_EQUAL(str, "89dfed81253840a81164dee0ed6be878");
}